

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O2

S2Point * S2::GetCentroid(S2Point *__return_storage_ptr__,S2Shape *shape)

{
  int iVar1;
  uint uVar2;
  uint chain_id;
  S2PointLoopSpan loop;
  S2PointSpan polyline;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2Point local_60 [2];
  
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  __return_storage_ptr__->c_[2] = 0.0;
  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*shape->_vptr_S2Shape[4])(shape);
  uVar2 = (*shape->_vptr_S2Shape[6])(shape);
  chain_id = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != chain_id; chain_id = chain_id + 1) {
    if (iVar1 == 1) {
      GetChainVertices(shape,chain_id,&vertices);
      polyline.len_ = 0x18;
      polyline.ptr_ =
           (pointer)(((long)vertices.
                            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)vertices.
                           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x18);
      GetCentroid(local_60,(S2 *)vertices.
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,polyline);
      util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
                (__return_storage_ptr__,local_60);
    }
    else if (iVar1 == 0) {
      (*shape->_vptr_S2Shape[3])(local_60,shape,(ulong)chain_id);
      util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
                (__return_storage_ptr__,local_60);
    }
    else {
      GetChainVertices(shape,chain_id,&vertices);
      loop.super_S2PointSpan.len_ =
           ((long)vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      loop.super_S2PointSpan.ptr_ =
           vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
      GetCentroid(local_60,loop);
      util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
                (__return_storage_ptr__,local_60);
    }
  }
  std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
            (&vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>);
  return __return_storage_ptr__;
}

Assistant:

S2Point GetCentroid(const S2Shape& shape) {
  S2Point centroid;
  vector<S2Point> vertices;
  int dimension = shape.dimension();
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    switch (dimension) {
      case 0:
        centroid += shape.edge(chain_id).v0;
        break;
      case 1:
        GetChainVertices(shape, chain_id, &vertices);
        centroid += S2::GetCentroid(S2PointSpan(vertices));
        break;
      default:
        GetChainVertices(shape, chain_id, &vertices);
        centroid += S2::GetCentroid(S2PointLoopSpan(vertices));
        break;
    }
  }
  return centroid;
}